

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# urlapi.c
# Opt level: O3

char * concat_url(char *base,char *relurl)

{
  char cVar1;
  byte bVar2;
  _Bool _Var3;
  char *__haystack;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  size_t __n;
  long lVar8;
  bool bVar9;
  bool bVar10;
  int iVar11;
  byte *pbVar12;
  char cVar13;
  long lVar14;
  byte *buffer;
  byte *pbVar15;
  
  __haystack = (*Curl_cstrdup)(base);
  if (__haystack == (char *)0x0) {
    return (char *)0x0;
  }
  pcVar4 = strstr(__haystack,"//");
  pcVar7 = pcVar4 + 2;
  if (pcVar4 == (char *)0x0) {
    pcVar7 = __haystack;
  }
  cVar1 = *relurl;
  if (cVar1 == '/') {
    if (relurl[1] != '/') {
      pcVar4 = strchr(pcVar7,0x2f);
      pcVar6 = strchr(pcVar7,0x3f);
      if (pcVar4 == (char *)0x0) {
        if (pcVar6 != (char *)0x0) {
          *pcVar6 = '\0';
        }
      }
      else {
        pcVar5 = pcVar4;
        if (pcVar6 < pcVar4) {
          pcVar5 = pcVar6;
        }
        if (pcVar6 == (char *)0x0) {
          pcVar5 = pcVar4;
        }
        *pcVar5 = '\0';
      }
      goto LAB_0014412a;
    }
    *pcVar7 = '\0';
    pbVar15 = (byte *)(relurl + 2);
    relurl = find_host_sep((char *)pbVar15);
    bVar10 = false;
  }
  else {
    pcVar4 = strchr(pcVar7,0x3f);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
      cVar1 = *relurl;
    }
    cVar13 = '?';
    if ((cVar1 != '?') && (pcVar4 = strrchr(pcVar7,0x2f), cVar13 = cVar1, pcVar4 != (char *)0x0)) {
      *pcVar4 = '\0';
      cVar13 = *relurl;
    }
    pcVar5 = strchr(pcVar7,0x2f);
    pcVar4 = pcVar5 + 1;
    pcVar6 = pcVar4;
    if (pcVar5 == (char *)0x0) {
      pcVar6 = (char *)0x0;
    }
    iVar11 = 0;
    if ((cVar13 == '.') &&
       (relurl = relurl + (ulong)(relurl[1] == '/') * 2, iVar11 = 0, *relurl == 0x2e)) {
      iVar11 = 0;
      pbVar15 = (byte *)relurl;
      do {
        relurl = (char *)pbVar15;
        if ((pbVar15[1] != 0x2e) || (pbVar15[2] != 0x2f)) break;
        iVar11 = iVar11 + 1;
        relurl = (char *)(pbVar15 + 3);
        pbVar12 = pbVar15 + 3;
        pbVar15 = (byte *)relurl;
      } while (*pbVar12 == 0x2e);
    }
    pcVar7 = pcVar4;
    if (pcVar5 == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      for (; iVar11 != 0; iVar11 = iVar11 + -1) {
        pcVar7 = strrchr(pcVar6,0x2f);
        if (pcVar7 == (char *)0x0) {
          *pcVar6 = '\0';
          pcVar7 = pcVar4;
          break;
        }
        *pcVar7 = '\0';
        pcVar7 = pcVar6;
      }
    }
LAB_0014412a:
    bVar10 = true;
    pbVar15 = (byte *)relurl;
  }
  bVar2 = *pbVar15;
  if (bVar2 == 0) {
    lVar14 = 1;
  }
  else {
    bVar9 = true;
    lVar14 = 0;
    pbVar12 = pbVar15;
    do {
      if (pbVar12 < relurl) {
        lVar14 = lVar14 + 1;
      }
      else if (bVar2 == 0x20) {
        if (bVar9) {
          lVar14 = lVar14 + 3;
          bVar9 = true;
        }
        else {
          lVar14 = lVar14 + 1;
          bVar9 = false;
        }
      }
      else {
        if (bVar2 == 0x3f) {
          bVar9 = false;
        }
        _Var3 = urlchar_needs_escaping((uint)bVar2);
        lVar8 = lVar14 + 2;
        if (!_Var3) {
          lVar8 = lVar14;
        }
        lVar14 = lVar8 + 1;
      }
      bVar2 = pbVar12[1];
      pbVar12 = pbVar12 + 1;
    } while (bVar2 != 0);
    lVar14 = lVar14 + 1;
  }
  __n = strlen(__haystack);
  pcVar4 = (char *)(*Curl_cmalloc)(__n + 1 + lVar14);
  if (pcVar4 == (char *)0x0) {
    pcVar4 = (char *)0x0;
    goto LAB_001442a6;
  }
  memcpy(pcVar4,__haystack,__n);
  bVar2 = *pbVar15;
  if (bVar2 != 0x2f) {
    if (pcVar7 == (char *)0x0) {
      if (bVar2 != 0x3f) goto LAB_001441ef;
    }
    else if ((bVar2 != 0x3f) && (*pcVar7 != '\0')) {
LAB_001441ef:
      pcVar4[__n] = '/';
      __n = __n + 1;
    }
  }
  pbVar12 = pbVar15;
  if (!bVar10) {
    pbVar12 = (byte *)find_host_sep((char *)pbVar15);
  }
  buffer = (byte *)(pcVar4 + __n);
  bVar2 = *pbVar15;
  if (bVar2 != 0) {
    bVar10 = true;
    do {
      if (pbVar15 < pbVar12) {
        *buffer = bVar2;
LAB_00144280:
        buffer = buffer + 1;
      }
      else if (bVar2 == 0x20) {
        if (bVar10) {
          buffer[0] = 0x25;
          buffer[1] = 0x32;
          buffer[2] = 0x30;
          buffer = buffer + 3;
          bVar10 = true;
        }
        else {
          *buffer = 0x2b;
          buffer = buffer + 1;
          bVar10 = false;
        }
      }
      else {
        if (bVar2 == 0x3f) {
          bVar10 = false;
        }
        _Var3 = urlchar_needs_escaping((uint)bVar2);
        if (!_Var3) {
          *buffer = *pbVar15;
          goto LAB_00144280;
        }
        curl_msnprintf((char *)buffer,4,"%%%02x",(ulong)*pbVar15);
        buffer = buffer + 3;
      }
      bVar2 = pbVar15[1];
      pbVar15 = pbVar15 + 1;
    } while (bVar2 != 0);
  }
  *buffer = 0;
LAB_001442a6:
  (*Curl_cfree)(__haystack);
  return pcVar4;
}

Assistant:

static char *concat_url(const char *base, const char *relurl)
{
  /***
   TRY to append this new path to the old URL
   to the right of the host part. Oh crap, this is doomed to cause
   problems in the future...
  */
  char *newest;
  char *protsep;
  char *pathsep;
  size_t newlen;
  bool host_changed = FALSE;

  const char *useurl = relurl;
  size_t urllen;

  /* we must make our own copy of the URL to play with, as it may
     point to read-only data */
  char *url_clone = strdup(base);

  if(!url_clone)
    return NULL; /* skip out of this NOW */

  /* protsep points to the start of the host name */
  protsep = strstr(url_clone, "//");
  if(!protsep)
    protsep = url_clone;
  else
    protsep += 2; /* pass the slashes */

  if('/' != relurl[0]) {
    int level = 0;

    /* First we need to find out if there's a ?-letter in the URL,
       and cut it and the right-side of that off */
    pathsep = strchr(protsep, '?');
    if(pathsep)
      *pathsep = 0;

    /* we have a relative path to append to the last slash if there's one
       available, or if the new URL is just a query string (starts with a
       '?')  we append the new one at the end of the entire currently worked
       out URL */
    if(useurl[0] != '?') {
      pathsep = strrchr(protsep, '/');
      if(pathsep)
        *pathsep = 0;
    }

    /* Check if there's any slash after the host name, and if so, remember
       that position instead */
    pathsep = strchr(protsep, '/');
    if(pathsep)
      protsep = pathsep + 1;
    else
      protsep = NULL;

    /* now deal with one "./" or any amount of "../" in the newurl
       and act accordingly */

    if((useurl[0] == '.') && (useurl[1] == '/'))
      useurl += 2; /* just skip the "./" */

    while((useurl[0] == '.') &&
          (useurl[1] == '.') &&
          (useurl[2] == '/')) {
      level++;
      useurl += 3; /* pass the "../" */
    }

    if(protsep) {
      while(level--) {
        /* cut off one more level from the right of the original URL */
        pathsep = strrchr(protsep, '/');
        if(pathsep)
          *pathsep = 0;
        else {
          *protsep = 0;
          break;
        }
      }
    }
  }
  else {
    /* We got a new absolute path for this server */

    if((relurl[0] == '/') && (relurl[1] == '/')) {
      /* the new URL starts with //, just keep the protocol part from the
         original one */
      *protsep = 0;
      useurl = &relurl[2]; /* we keep the slashes from the original, so we
                              skip the new ones */
      host_changed = TRUE;
    }
    else {
      /* cut off the original URL from the first slash, or deal with URLs
         without slash */
      pathsep = strchr(protsep, '/');
      if(pathsep) {
        /* When people use badly formatted URLs, such as
           "http://www.url.com?dir=/home/daniel" we must not use the first
           slash, if there's a ?-letter before it! */
        char *sep = strchr(protsep, '?');
        if(sep && (sep < pathsep))
          pathsep = sep;
        *pathsep = 0;
      }
      else {
        /* There was no slash. Now, since we might be operating on a badly
           formatted URL, such as "http://www.url.com?id=2380" which doesn't
           use a slash separator as it is supposed to, we need to check for a
           ?-letter as well! */
        pathsep = strchr(protsep, '?');
        if(pathsep)
          *pathsep = 0;
      }
    }
  }

  /* If the new part contains a space, this is a mighty stupid redirect
     but we still make an effort to do "right". To the left of a '?'
     letter we replace each space with %20 while it is replaced with '+'
     on the right side of the '?' letter.
  */
  newlen = strlen_url(useurl, !host_changed);

  urllen = strlen(url_clone);

  newest = malloc(urllen + 1 + /* possible slash */
                  newlen + 1 /* zero byte */);

  if(!newest) {
    free(url_clone); /* don't leak this */
    return NULL;
  }

  /* copy over the root url part */
  memcpy(newest, url_clone, urllen);

  /* check if we need to append a slash */
  if(('/' == useurl[0]) || (protsep && !*protsep) || ('?' == useurl[0]))
    ;
  else
    newest[urllen++]='/';

  /* then append the new piece on the right side */
  strcpy_url(&newest[urllen], useurl, !host_changed);

  free(url_clone);

  return newest;
}